

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<long_double,_short>::Run
          (DataTransform<long_double,_short> *this,istream *input_stream)

{
  short sVar1;
  short sVar2;
  NumericType NVar3;
  WarningType WVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ostream *poVar8;
  size_t sVar9;
  short data_to_write;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  char buffer [128];
  string local_280;
  string *local_260;
  long local_258;
  ulong local_250;
  longdouble local_248;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_260 = &this->print_format_;
  iVar13 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar10 = 2;
        bVar5 = false;
        lVar14 = in_ST0;
      }
      else {
        piVar6 = __errno_location();
        iVar10 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_280);
        if (local_280._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_0014559b:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar10;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_0014559b;
        }
        iVar10 = 0;
        bVar5 = true;
        lVar14 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_248 = in_ST0;
      }
      in_ST0 = lVar14;
      if (local_230 != local_220) {
        operator_delete(local_230);
        in_ST0 = lVar14;
      }
      if (bVar5) {
LAB_001451f7:
        sVar1 = (short)ROUND(local_248);
        data_to_write = this->minimum_value_;
        sVar2 = this->maximum_value_;
        if (data_to_write < sVar2) {
          NVar3 = this->input_numeric_type_;
          if (NVar3 == kFloatingPoint) {
            bVar5 = true;
            in_ST6 = in_ST5;
            if (((longdouble)data_to_write <= local_248) &&
               (data_to_write = sVar2, local_248 <= (longdouble)sVar2)) goto LAB_0014530a;
          }
          else {
            uVar11 = (ulong)sVar2;
            if (NVar3 == kUnsignedInteger) {
              lVar15 = (longdouble)9.223372e+18;
              lVar14 = (longdouble)0;
              if (lVar15 <= local_248) {
                lVar14 = lVar15;
              }
              local_250 = (ulong)ROUND(local_248 - lVar14);
              uVar12 = (ulong)(lVar15 <= local_248) << 0x3f ^ local_250;
              bVar5 = true;
              in_ST5 = in_ST4;
              in_ST6 = in_ST4;
              if (((ulong)(long)data_to_write <= uVar12) &&
                 (bVar5 = uVar11 < uVar12, data_to_write = sVar1, bVar5)) {
                data_to_write = sVar2;
              }
            }
            else {
              if (NVar3 != kSignedInteger) goto LAB_0014530a;
              local_258 = (long)ROUND(local_248);
              bVar5 = true;
              in_ST6 = in_ST5;
              if ((data_to_write <= local_258) &&
                 (bVar5 = (long)uVar11 < local_258, data_to_write = sVar1, (long)uVar11 < local_258)
                 ) {
                data_to_write = sVar2;
              }
            }
          }
        }
        else {
LAB_0014530a:
          bVar5 = false;
          data_to_write = sVar1;
        }
        if ((!bVar5) && (this->rounding_ != false)) {
          in_ST6 = in_ST5;
          if (local_248 <= (longdouble)0) {
            data_to_write = (short)ROUND(local_248 + (longdouble)-0.5);
          }
          else {
            data_to_write = (short)ROUND(local_248 + (longdouble)0.5);
          }
        }
        in_ST7 = in_ST6;
        if ((bool)(bVar5 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"x2x","");
          sptk::PrintErrorMessage(&local_280,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar10 = 1;
          if (WVar4 == kExit) goto LAB_001454ee;
        }
        if (this->is_ascii_output_ == true) {
          bVar5 = sptk::SnPrintf<short>(data_to_write,local_260,0x80,local_b8);
          iVar10 = 1;
          if (bVar5) {
            sVar9 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9)
            ;
            if ((iVar13 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_001454ec:
            iVar10 = 0;
          }
        }
        else {
          bVar5 = sptk::WriteStream<short>(data_to_write,(ostream *)&std::cout);
          iVar10 = 1;
          if (bVar5) goto LAB_001454ec;
        }
      }
    }
    else {
      bVar5 = sptk::ReadStream<long_double>(&local_248,input_stream);
      iVar10 = 2;
      if (bVar5) goto LAB_001451f7;
    }
LAB_001454ee:
    if (iVar10 != 0) {
      if (iVar10 == 2) {
        bVar5 = true;
        if ((this->is_ascii_output_ == true) && (iVar13 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar5 = false;
      }
      return bVar5;
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }